

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowCustomAggregatorState::~WindowCustomAggregatorState(WindowCustomAggregatorState *this)

{
  long lVar1;
  FunctionData *ptr_p;
  AggregateObject *in_RDI;
  AggregateInputData aggr_input_data;
  optional_ptr<duckdb::FunctionData,_true> local_28;
  AggregateInputData local_20;
  
  (in_RDI->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__WindowCustomAggregatorState_03534d78;
  lVar1._0_1_ = in_RDI->aggr_type;
  lVar1._1_1_ = in_RDI->return_type;
  lVar1._2_6_ = *(undefined6 *)&in_RDI->field_0x152;
  if (lVar1 != 0) {
    ptr_p = AggregateObject::GetFunctionData(in_RDI);
    optional_ptr<duckdb::FunctionData,_true>::optional_ptr(&local_28,ptr_p);
    AggregateInputData::AggregateInputData
              (&local_20,local_28,
               (ArenaAllocator *)
               &(in_RDI->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name
               ,PRESERVE_INPUT);
    (**(code **)&in_RDI->aggr_type)
              ((pointer *)
               ((long)&in_RDI[1].function.super_BaseScalarFunction.super_SimpleFunction.
                       original_arguments.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl + 0x10),&local_20,1);
  }
  vector<duckdb::FrameBounds,_true>::~vector((vector<duckdb::FrameBounds,_true> *)0x1a38042);
  Vector::~Vector((Vector *)in_RDI);
  vector<unsigned_char,_true>::~vector((vector<unsigned_char,_true> *)0x1a38064);
  AggregateObject::~AggregateObject(in_RDI);
  WindowAggregatorLocalState::~WindowAggregatorLocalState((WindowAggregatorLocalState *)in_RDI);
  return;
}

Assistant:

WindowCustomAggregatorState::~WindowCustomAggregatorState() {
	if (aggr.function.destructor) {
		AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
		aggr.function.destructor(statef, aggr_input_data, 1);
	}
}